

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void __thiscall cs::statement_loop::dump(statement_loop *this,ostream *o)

{
  _Elt_pointer ppsVar1;
  _Map_pointer pppsVar2;
  _Elt_pointer ppsVar3;
  statement_base **ptr;
  _Elt_pointer ppsVar4;
  
  std::operator<<(o,"< BeginLoop >\n");
  ppsVar4 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar3 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  pppsVar2 = (this->mBlock).
             super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  ppsVar1 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  while (ppsVar4 != ppsVar1) {
    (*(*ppsVar4)->_vptr_statement_base[5])(*ppsVar4,o);
    ppsVar4 = ppsVar4 + 1;
    if (ppsVar4 == ppsVar3) {
      ppsVar4 = pppsVar2[1];
      pppsVar2 = pppsVar2 + 1;
      ppsVar3 = ppsVar4 + 0x40;
    }
  }
  std::operator<<(o,"< EndLoop >\n");
  return;
}

Assistant:

void statement_loop::dump(std::ostream &o) const
	{
		o << "< BeginLoop >\n";
		for (auto &ptr: mBlock)
			ptr->dump(o);
		o << "< EndLoop >\n";
	}